

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

char * concat_url(char *base,char *relurl)

{
  byte bVar1;
  _Bool _Var2;
  char *sep;
  char *__haystack;
  char *pcVar3;
  char *pcVar4;
  byte *pbVar5;
  size_t __n;
  char *pcVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  long lVar11;
  byte *pbVar12;
  char *__s;
  
  __haystack = (*Curl_cstrdup)(base);
  if (__haystack == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar3 = strstr(__haystack,"//");
  __s = pcVar3 + 2;
  if (pcVar3 == (char *)0x0) {
    __s = __haystack;
  }
  if (*relurl == '/') {
    if (relurl[1] == '/') {
      *__s = '\0';
      relurl = relurl + 2;
      bVar10 = false;
    }
    else {
      pcVar3 = strchr(__s,0x2f);
      pcVar4 = strchr(__s,0x3f);
      if (pcVar3 == (char *)0x0) {
        bVar10 = true;
        if (pcVar4 != (char *)0x0) {
          *pcVar4 = '\0';
        }
      }
      else {
        pcVar6 = pcVar3;
        if (pcVar4 < pcVar3) {
          pcVar6 = pcVar4;
        }
        if (pcVar4 == (char *)0x0) {
          pcVar6 = pcVar3;
        }
        *pcVar6 = '\0';
        bVar10 = true;
      }
    }
  }
  else {
    pcVar3 = strchr(__s,0x3f);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    if ((*relurl != '?') && (pcVar3 = strrchr(__s,0x2f), pcVar3 != (char *)0x0)) {
      *pcVar3 = '\0';
    }
    pcVar3 = strchr(__s,0x2f);
    __s = pcVar3 + 1;
    if (pcVar3 == (char *)0x0) {
      __s = (char *)0x0;
    }
    if (*relurl == '.') {
      relurl = relurl + (ulong)(relurl[1] == '/') * 2;
    }
    iVar8 = 0;
    if (*relurl == 0x2e) {
      iVar8 = 0;
      pbVar5 = (byte *)relurl;
      do {
        relurl = (char *)pbVar5;
        if ((pbVar5[1] != 0x2e) || (pbVar5[2] != 0x2f)) break;
        iVar8 = iVar8 + 1;
        relurl = (char *)(pbVar5 + 3);
        pbVar12 = pbVar5 + 3;
        pbVar5 = (byte *)relurl;
      } while (*pbVar12 == 0x2e);
    }
    bVar10 = true;
    if (iVar8 != 0 && pcVar3 != (char *)0x0) {
      do {
        pcVar3 = strrchr(__s,0x2f);
        if (pcVar3 == (char *)0x0) {
          *__s = '\0';
          break;
        }
        *pcVar3 = '\0';
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
  }
  pbVar5 = (byte *)relurl;
  if (!bVar10) {
    pbVar5 = (byte *)find_host_sep(relurl);
  }
  bVar1 = *relurl;
  if (bVar1 == 0) {
    lVar11 = 1;
  }
  else {
    bVar9 = true;
    lVar11 = 0;
    pbVar12 = (byte *)relurl;
    do {
      if (pbVar12 < pbVar5) {
LAB_00145f20:
        lVar11 = lVar11 + 1;
      }
      else if (bVar1 == 0x20) {
        if (!bVar9) goto LAB_00145f20;
        lVar11 = lVar11 + 3;
      }
      else {
        if (bVar1 == 0x3f) {
          bVar9 = false;
        }
        _Var2 = urlchar_needs_escaping((uint)bVar1);
        lVar7 = lVar11 + 2;
        if (!_Var2) {
          lVar7 = lVar11;
        }
        lVar11 = lVar7 + 1;
      }
      bVar1 = pbVar12[1];
      pbVar12 = pbVar12 + 1;
    } while (bVar1 != 0);
    lVar11 = lVar11 + 1;
  }
  __n = strlen(__haystack);
  pcVar3 = (char *)(*Curl_cmalloc)(__n + 1 + lVar11);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
    goto LAB_00146070;
  }
  memcpy(pcVar3,__haystack,__n);
  bVar1 = *relurl;
  if (bVar1 != 0x2f) {
    if (__s == (char *)0x0) {
      if (bVar1 != 0x3f) goto LAB_00145fc8;
    }
    else if ((bVar1 != 0x3f) && (*__s != '\0')) {
LAB_00145fc8:
      pcVar3[__n] = '/';
      __n = __n + 1;
    }
  }
  pbVar5 = (byte *)relurl;
  if (!bVar10) {
    pbVar5 = (byte *)find_host_sep(relurl);
  }
  pbVar12 = (byte *)(pcVar3 + __n);
  bVar1 = *relurl;
  if (bVar1 != 0) {
    bVar10 = true;
    do {
      if (relurl < pbVar5) {
        *pbVar12 = bVar1;
LAB_00146057:
        pbVar12 = pbVar12 + 1;
      }
      else {
        if (bVar1 == 0x20) {
          if (bVar10) {
            pbVar12[0] = 0x25;
            pbVar12[1] = 0x32;
            pbVar12[2] = 0x30;
            goto LAB_00146046;
          }
          *pbVar12 = 0x2b;
          goto LAB_00146057;
        }
        if (bVar1 == 0x3f) {
          bVar10 = false;
        }
        _Var2 = urlchar_needs_escaping((uint)bVar1);
        if (!_Var2) {
          *pbVar12 = *relurl;
          goto LAB_00146057;
        }
        curl_msnprintf((char *)pbVar12,4,"%%%02x",(ulong)(byte)*relurl);
LAB_00146046:
        pbVar12 = pbVar12 + 3;
      }
      bVar1 = ((byte *)relurl)[1];
      relurl = (char *)((byte *)relurl + 1);
    } while (bVar1 != 0);
  }
  *pbVar12 = 0;
LAB_00146070:
  (*Curl_cfree)(__haystack);
  return pcVar3;
}

Assistant:

static char *concat_url(const char *base, const char *relurl)
{
  /***
   TRY to append this new path to the old URL
   to the right of the host part. Oh crap, this is doomed to cause
   problems in the future...
  */
  char *newest;
  char *protsep;
  char *pathsep;
  size_t newlen;
  bool host_changed = FALSE;

  const char *useurl = relurl;
  size_t urllen;

  /* we must make our own copy of the URL to play with, as it may
     point to read-only data */
  char *url_clone = strdup(base);

  if(!url_clone)
    return NULL; /* skip out of this NOW */

  /* protsep points to the start of the host name */
  protsep = strstr(url_clone, "//");
  if(!protsep)
    protsep = url_clone;
  else
    protsep += 2; /* pass the slashes */

  if('/' != relurl[0]) {
    int level = 0;

    /* First we need to find out if there's a ?-letter in the URL,
       and cut it and the right-side of that off */
    pathsep = strchr(protsep, '?');
    if(pathsep)
      *pathsep = 0;

    /* we have a relative path to append to the last slash if there's one
       available, or if the new URL is just a query string (starts with a
       '?')  we append the new one at the end of the entire currently worked
       out URL */
    if(useurl[0] != '?') {
      pathsep = strrchr(protsep, '/');
      if(pathsep)
        *pathsep = 0;
    }

    /* Check if there's any slash after the host name, and if so, remember
       that position instead */
    pathsep = strchr(protsep, '/');
    if(pathsep)
      protsep = pathsep + 1;
    else
      protsep = NULL;

    /* now deal with one "./" or any amount of "../" in the newurl
       and act accordingly */

    if((useurl[0] == '.') && (useurl[1] == '/'))
      useurl += 2; /* just skip the "./" */

    while((useurl[0] == '.') &&
          (useurl[1] == '.') &&
          (useurl[2] == '/')) {
      level++;
      useurl += 3; /* pass the "../" */
    }

    if(protsep) {
      while(level--) {
        /* cut off one more level from the right of the original URL */
        pathsep = strrchr(protsep, '/');
        if(pathsep)
          *pathsep = 0;
        else {
          *protsep = 0;
          break;
        }
      }
    }
  }
  else {
    /* We got a new absolute path for this server */

    if((relurl[0] == '/') && (relurl[1] == '/')) {
      /* the new URL starts with //, just keep the protocol part from the
         original one */
      *protsep = 0;
      useurl = &relurl[2]; /* we keep the slashes from the original, so we
                              skip the new ones */
      host_changed = TRUE;
    }
    else {
      /* cut off the original URL from the first slash, or deal with URLs
         without slash */
      pathsep = strchr(protsep, '/');
      if(pathsep) {
        /* When people use badly formatted URLs, such as
           "http://www.url.com?dir=/home/daniel" we must not use the first
           slash, if there's a ?-letter before it! */
        char *sep = strchr(protsep, '?');
        if(sep && (sep < pathsep))
          pathsep = sep;
        *pathsep = 0;
      }
      else {
        /* There was no slash. Now, since we might be operating on a badly
           formatted URL, such as "http://www.url.com?id=2380" which doesn't
           use a slash separator as it is supposed to, we need to check for a
           ?-letter as well! */
        pathsep = strchr(protsep, '?');
        if(pathsep)
          *pathsep = 0;
      }
    }
  }

  /* If the new part contains a space, this is a mighty stupid redirect
     but we still make an effort to do "right". To the left of a '?'
     letter we replace each space with %20 while it is replaced with '+'
     on the right side of the '?' letter.
  */
  newlen = strlen_url(useurl, !host_changed);

  urllen = strlen(url_clone);

  newest = malloc(urllen + 1 + /* possible slash */
                  newlen + 1 /* zero byte */);

  if(!newest) {
    free(url_clone); /* don't leak this */
    return NULL;
  }

  /* copy over the root url part */
  memcpy(newest, url_clone, urllen);

  /* check if we need to append a slash */
  if(('/' == useurl[0]) || (protsep && !*protsep) || ('?' == useurl[0]))
    ;
  else
    newest[urllen++]='/';

  /* then append the new piece on the right side */
  strcpy_url(&newest[urllen], useurl, !host_changed);

  free(url_clone);

  return newest;
}